

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_conv.c
# Opt level: O2

void print_IOConversion_as_XML(IOConversionPtr conv_ptr,int indent)

{
  IOconvFieldStruct *pIVar1;
  FMVarInfoStruct *pFVar2;
  FMDimen *pFVar3;
  FMFieldList p_Var4;
  char *pcVar5;
  long lVar6;
  int j;
  long lVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  
  if (indent == 0) {
    printf("<IOConversion baseType=\"");
    if (conv_ptr == (IOConversionPtr)0x0) {
      printf("NULL\" />");
      return;
    }
    if ((ulong)conv_ptr->conversion_type < 4) {
      printf(&DAT_00135334 + *(int *)(&DAT_00135334 + (ulong)conv_ptr->conversion_type * 4));
    }
    puts("\">");
  }
  iVar9 = 0;
  iVar8 = 0;
  if (0 < indent) {
    iVar9 = indent;
    iVar8 = indent;
  }
  while (iVar9 != 0) {
    printf("    ");
    iVar9 = iVar9 + -1;
  }
  printf("<baseSizeDelta>%zd</baseSizeDelta>\n",conv_ptr->base_size_delta);
  printf("<maxVarExpansion>%g</maxVarExpansion>\n",conv_ptr->max_var_expansion);
  printf("<targetPointerSize>%d</targetPointerSize>\n",(ulong)(uint)conv_ptr->target_pointer_size);
  printf("<stringOffsetSize>%zd</stringOffsetSize>\n",conv_ptr->string_offset_size);
  printf("<convertedStrings>%d</convertedStrings>\n",(ulong)(uint)conv_ptr->converted_strings);
  iVar9 = iVar8;
  while (bVar10 = iVar9 != 0, iVar9 = iVar9 + -1, bVar10) {
    printf("    ");
  }
  for (lVar6 = 0; lVar6 < conv_ptr->conv_count; lVar6 = lVar6 + 1) {
    pIVar1 = conv_ptr->conversions + lVar6;
    pFVar2 = conv_ptr->conversions[lVar6].iovar;
    iVar9 = iVar8;
    while (bVar10 = iVar9 != 0, iVar9 = iVar9 + -1, bVar10) {
      printf("    ");
    }
    puts("<registeredConversion>");
    iVar9 = iVar8;
    while (bVar10 = iVar9 != 0, iVar9 = iVar9 + -1, bVar10) {
      printf("    ");
    }
    pcVar5 = data_type_to_str((pIVar1->src_field).data_type);
    printf("<baseType>%s</baseType>\n",pcVar5);
    puts("<controlField>");
    if (pIVar1->iovar != (FMVarInfoStruct *)0x0) {
      for (lVar7 = 0; lVar7 < pFVar2->dimen_count; lVar7 = lVar7 + 1) {
        pFVar3 = pFVar2->dimens;
        if (pFVar3[lVar7].static_size == 0) {
          iVar9 = pFVar3[lVar7].control_field_index;
          p_Var4 = conv_ptr->ioformat->body->field_list;
          printf("<offset>%d</offset><size units=\"bytes\">%d</size>\n",
                 (ulong)(uint)p_Var4[iVar9].field_offset,(ulong)(uint)p_Var4[iVar9].field_size);
        }
        else {
          printf("<arrayDimension>%d</arrayDimension>");
        }
      }
    }
    puts("</controlField>");
    iVar9 = iVar8;
    if ((pIVar1->src_field).byte_swap == '\0') {
      putchar(10);
    }
    else {
      puts("<byteReversal />");
    }
    while (iVar9 != 0) {
      printf("    ");
      iVar9 = iVar9 + -1;
    }
    printf("<sourceOffset>%zd</sourceOffset><sourceSize>%d</sourceSize>\n",
           (pIVar1->src_field).offset,(ulong)(uint)(pIVar1->src_field).size);
    iVar9 = iVar8;
    while (bVar10 = iVar9 != 0, iVar9 = iVar9 + -1, bVar10) {
      printf("    ");
    }
    printf("<destOffset>%zd</destOffset><destSize>%d</destSize>\n",pIVar1->dest_offset,
           (ulong)(uint)pIVar1->dest_size);
    iVar9 = iVar8;
    if (pIVar1->subconversion != (IOConversionPtr)0x0) {
      while (iVar9 != 0) {
        printf("    ");
        iVar9 = iVar9 + -1;
      }
      if (pIVar1->subconversion == conv_ptr) {
        puts("    Subconversion is recursive");
      }
      else {
        print_IOConversion_as_XML(pIVar1->subconversion,indent + 1);
      }
    }
  }
  puts("</IOConversion>");
  return;
}

Assistant:

static void
print_IOConversion_as_XML(IOConversionPtr conv_ptr, int indent)
{
    int i;
    int ind;
    if (indent == 0) {
	for (ind = 0; ind < indent; ind++)
	    printf("    ");
	printf("<IOConversion baseType=\"");
	if (conv_ptr == NULL) {
	    printf("NULL\" />");
	    return;
	}
	switch (conv_ptr->conversion_type) {
	case none_required:
	    printf("None_Required");
	    break;
	case direct_to_mem:
	    printf("Direct_to_Memory");
	    break;
	case buffer_and_convert:
	    printf("Buffer_and_Convert");
	    break;
	case copy_dynamic_portion:
	    printf("Copy_Strings");
	    break;
	default:
	    assert(FALSE);
	    break;
	}
	printf("\">\n");
    }
    for (ind = 0; ind < indent; ind++)
	printf("    ");
    printf("<baseSizeDelta>%zd</baseSizeDelta>\n", conv_ptr->base_size_delta);
    printf("<maxVarExpansion>%g</maxVarExpansion>\n", conv_ptr->max_var_expansion);
    printf("<targetPointerSize>%d</targetPointerSize>\n", conv_ptr->target_pointer_size);
    printf("<stringOffsetSize>%zd</stringOffsetSize>\n", conv_ptr->string_offset_size);
    printf("<convertedStrings>%d</convertedStrings>\n", conv_ptr->converted_strings);
    for (ind = 0; ind < indent; ind++)
	printf("    ");
    for (i = 0; i < conv_ptr->conv_count; i++) {
	FMFieldPtr src_field = &conv_ptr->conversions[i].src_field;
	FMVarInfoStruct *iovar = conv_ptr->conversions[i].iovar;

	for (ind = 0; ind < indent; ind++)
	    printf("    ");
	printf("<registeredConversion>\n");
	for (ind = 0; ind < indent; ind++)
	    printf("    ");
	printf("<baseType>%s</baseType>\n",
	 data_type_to_str(src_field->data_type));
	printf("<controlField>\n");
	if (conv_ptr->conversions[i].iovar != NULL) {
	    int j;
	    for (j = 0; j < iovar->dimen_count; j++) {
		if (iovar->dimens[j].static_size != 0) {
		    printf("<arrayDimension>%d</arrayDimension>", 
			   iovar->dimens[j].static_size);
		} else {
		    int field = iovar->dimens[j].control_field_index;
		    FMFormat f = conv_ptr->ioformat->body;
		    int offset = f->field_list[field].field_offset;
		    int size = f->field_list[field].field_size;
		    /* variant array */
		    printf("<offset>%d</offset><size units=\"bytes\">%d</size>\n",
			   offset, size);
		}
	    }
	}
	printf("</controlField>\n");
	if (src_field->byte_swap) {
	    printf("<byteReversal />\n");
	} else {
	    printf("\n");
	}
	for (ind = 0; ind < indent; ind++)
	    printf("    ");
	printf("<sourceOffset>%zd</sourceOffset><sourceSize>%d</sourceSize>\n",
	       src_field->offset,
	       src_field->size);
	for (ind = 0; ind < indent; ind++)
	    printf("    ");
	printf("<destOffset>%zd</destOffset><destSize>%d</destSize>\n",
	       conv_ptr->conversions[i].dest_offset,
	       conv_ptr->conversions[i].dest_size);
	if (conv_ptr->conversions[i].subconversion) {
	    for (ind = 0; ind < indent; ind++)
		printf("    ");
	    if (conv_ptr->conversions[i].subconversion == conv_ptr) {
		printf("    Subconversion is recursive\n");
	    } else {
		print_IOConversion_as_XML(conv_ptr->conversions[i].subconversion,
					  indent + 1);
	    }
	}
    }
    printf("</IOConversion>\n");
}